

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mddglobals.cpp
# Opt level: O0

void addMDDProp(vec<IntVar_*> *x,MDDTable *tab,MDDNodeInt m,MDDOpts *mopts)

{
  uint uVar1;
  vec<IntView<0>_> *pvVar2;
  vec<IntVar_*> *in_RDI;
  MDDTemplate *templ;
  uint i_2;
  uint i_1;
  MDDOpts *in_stack_00000098;
  vec<IntView<0>_> *in_stack_000000a0;
  uint i;
  vec<std::pair<int,_int>_> bounds;
  vec<IntView<0>_> w;
  vec<int> doms;
  IntView<0> *in_stack_ffffffffffffff08;
  IntVar *in_stack_ffffffffffffff10;
  IntView<0> local_90;
  uint local_80;
  uint local_7c;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  int local_70;
  MDDNodeInt in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffff98;
  uint uVar3;
  uint index;
  MDDTemplate *in_stack_ffffffffffffffa0;
  vec<IntView<0>_> local_40;
  vec<int> local_30 [2];
  vec<IntVar_*> *local_8;
  
  local_8 = in_RDI;
  vec<int>::vec(local_30);
  vec<IntView<0>_>::vec(&local_40);
  vec<std::pair<int,_int>_>::vec((vec<std::pair<int,_int>_> *)&stack0xffffffffffffffa0);
  uVar3 = 0;
  while( true ) {
    index = uVar3;
    uVar1 = vec<IntVar_*>::size(local_8);
    if (uVar1 <= uVar3) break;
    vec<IntVar_*>::operator[](local_8,index);
    local_70 = IntVar::getMin((IntVar *)0x18cf82);
    vec<IntVar_*>::operator[](local_8,index);
    in_stack_ffffffffffffff8c = IntVar::getMax((IntVar *)0x18cfbb);
    std::pair<int,_int>::pair<int,_int,_true>
              ((pair<int,_int> *)&stack0xffffffffffffff94,&local_70,(int *)&stack0xffffffffffffff8c)
    ;
    vec<std::pair<int,_int>_>::push
              ((vec<std::pair<int,_int>_> *)in_stack_ffffffffffffff10,
               (pair<int,_int> *)in_stack_ffffffffffffff08);
    vec<IntVar_*>::operator[](local_8,index);
    in_stack_ffffffffffffff88 = IntVar::getMax((IntVar *)0x18d02a);
    in_stack_ffffffffffffff88 = in_stack_ffffffffffffff88 + 1;
    vec<int>::push((vec<int> *)in_stack_ffffffffffffff10,(int *)in_stack_ffffffffffffff08);
    uVar3 = index + 1;
  }
  local_7c = 0;
  while( true ) {
    uVar3 = local_7c;
    uVar1 = vec<IntVar_*>::size(local_8);
    if (uVar1 <= uVar3) break;
    vec<IntVar_*>::operator[](local_8,local_7c);
    IntVar::specialiseToEL(in_stack_ffffffffffffff10);
    local_7c = local_7c + 1;
  }
  local_80 = 0;
  while( true ) {
    uVar3 = local_80;
    uVar1 = vec<IntVar_*>::size(local_8);
    if (uVar1 <= uVar3) break;
    pvVar2 = (vec<IntView<0>_> *)vec<IntVar_*>::operator[](local_8,local_80);
    IntView<0>::IntView(&local_90,*(IntVar **)pvVar2,1,0);
    vec<IntView<0>_>::push(pvVar2,in_stack_ffffffffffffff08);
    local_80 = local_80 + 1;
  }
  operator_new(0x70);
  MDDTemplate::MDDTemplate
            (in_stack_ffffffffffffffa0,(MDDTable *)CONCAT44(index,in_stack_ffffffffffffff98),
             in_stack_ffffffffffffff94,
             (vec<int> *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  pvVar2 = (vec<IntView<0>_> *)operator_new(0xf0);
  MDDProp<0>::MDDProp((MDDProp<0> *)bounds.data,(MDDTemplate *)bounds._0_8_,in_stack_000000a0,
                      in_stack_00000098);
  vec<std::pair<int,_int>_>::~vec((vec<std::pair<int,_int>_> *)pvVar2);
  vec<IntView<0>_>::~vec(pvVar2);
  vec<int>::~vec((vec<int> *)pvVar2);
  return;
}

Assistant:

static void addMDDProp(vec<IntVar*>& x, MDDTable& tab, MDDNodeInt m, const MDDOpts& mopts) {
	vec<int> doms;
	vec<IntView<> > w;

	vec<intpair> bounds;
	for (unsigned int i = 0; i < x.size(); i++) {
		bounds.push(intpair(x[i]->getMin(), x[i]->getMax()));
		doms.push(x[i]->getMax() + 1);
		// assert( x[i]->getMin() == 0 );
	}
	//   m = tab.bound(m, bounds);
	//   m = tab.expand(0, m);

	for (unsigned int i = 0; i < x.size(); i++) {
		x[i]->specialiseToEL();
	}
	for (unsigned int i = 0; i < x.size(); i++) {
		w.push(IntView<>(x[i], 1, 0));
	}

	auto* templ = new MDDTemplate(tab, m, doms);

	new MDDProp<0>(templ, w, mopts);
}